

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fwd_txfm_impl_sse2.h
# Opt level: O0

void fdct4x4_helper(int16_t *input,int stride,__m128i *in0,__m128i *in1)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  int in_ESI;
  undefined2 in_DI;
  undefined6 in_register_0000003a;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __m128i u3_1;
  __m128i u2_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i x1;
  __m128i x0;
  __m128i w3;
  __m128i w2;
  __m128i w1;
  __m128i w0;
  __m128i v3;
  __m128i v2;
  __m128i v1;
  __m128i v0;
  __m128i u3;
  __m128i u1;
  __m128i u2;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i r3;
  __m128i r2;
  __m128i r1;
  __m128i r0;
  __m128i mask;
  __m128i k__nonzero_bias_b;
  __m128i k__nonzero_bias_a;
  int DCT_CONST_BITS2;
  __m128i k__DCT_CONST_ROUNDING2;
  __m128i k__DCT_CONST_ROUNDING;
  __m128i k__cospi_H;
  __m128i k__cospi_G;
  __m128i k__cospi_F;
  __m128i k__cospi_E;
  __m128i k__cospi_D;
  __m128i k__cospi_C;
  __m128i k__cospi_B;
  __m128i k__cospi_A;
  undefined4 local_a18;
  undefined4 uStack_a14;
  undefined4 uStack_a10;
  undefined4 uStack_a0c;
  undefined4 local_a08;
  undefined4 uStack_a04;
  undefined4 uStack_a00;
  undefined4 uStack_9fc;
  short local_618;
  short sStack_616;
  short sStack_614;
  short sStack_612;
  short sStack_610;
  short sStack_60e;
  short sStack_60c;
  short sStack_60a;
  short local_608;
  short sStack_606;
  short sStack_604;
  short sStack_602;
  short sStack_600;
  short sStack_5fe;
  short sStack_5fc;
  short sStack_5fa;
  short local_5f8;
  short sStack_5f6;
  short sStack_5f4;
  short sStack_5f2;
  short sStack_5f0;
  short sStack_5ee;
  short sStack_5ec;
  short sStack_5ea;
  short local_5b8;
  undefined2 uStack_5b6;
  undefined2 uStack_5b4;
  undefined2 uStack_5b2;
  undefined2 uStack_5b0;
  undefined2 uStack_5ae;
  undefined2 uStack_5ac;
  undefined2 uStack_5aa;
  short local_598;
  short sStack_596;
  short sStack_594;
  short sStack_592;
  short sStack_590;
  short sStack_58e;
  short sStack_58c;
  short sStack_58a;
  short local_588;
  short sStack_586;
  short sStack_584;
  short sStack_582;
  short local_578;
  short sStack_576;
  short sStack_574;
  short sStack_572;
  short sStack_560;
  short sStack_55e;
  short sStack_55c;
  short sStack_55a;
  short sStack_550;
  short sStack_54e;
  short sStack_54c;
  short sStack_54a;
  short local_548;
  short sStack_546;
  short sStack_544;
  short sStack_542;
  short sStack_540;
  short sStack_53e;
  short sStack_53c;
  short sStack_53a;
  short local_538;
  short sStack_536;
  short sStack_534;
  short sStack_532;
  short sStack_530;
  short sStack_52e;
  short sStack_52c;
  short sStack_52a;
  int local_3f8;
  int iStack_3f4;
  int iStack_3f0;
  int iStack_3ec;
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  int local_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  __m128i w3_1;
  __m128i w2_1;
  __m128i w1_1;
  __m128i w0_1;
  __m128i v3_1;
  __m128i v2_1;
  __m128i v1_1;
  __m128i v0_1;
  
  puVar2 = (undefined8 *)CONCAT62(in_register_0000003a,in_DI);
  *(undefined8 *)*in_RDX = *puVar2;
  *(undefined8 *)(*in_RDX + 8) = 0;
  *(undefined8 *)*in_RCX = *(undefined8 *)((long)puVar2 + (long)in_ESI * 2);
  *(undefined8 *)(*in_RCX + 8) = 0;
  uVar1 = *(undefined8 *)((long)puVar2 + (long)(in_ESI * 2) * 2);
  *(undefined8 *)*in_RCX = *(undefined8 *)*in_RCX;
  *(undefined8 *)(*in_RCX + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)puVar2 + (long)(in_ESI * 3) * 2);
  *(undefined8 *)*in_RDX = *(undefined8 *)*in_RDX;
  *(undefined8 *)(*in_RDX + 8) = uVar1;
  auVar24 = psllw(*in_RDX,ZEXT416(4));
  *in_RDX = auVar24;
  auVar24 = psllw(*in_RCX,ZEXT416(4));
  *in_RCX = auVar24;
  uVar1 = *(undefined8 *)*in_RDX;
  uVar3 = *(undefined8 *)(*in_RDX + 8);
  local_618 = (short)uVar1;
  sStack_616 = (short)((ulong)uVar1 >> 0x10);
  sStack_614 = (short)((ulong)uVar1 >> 0x20);
  sStack_612 = (short)((ulong)uVar1 >> 0x30);
  sStack_610 = (short)uVar3;
  sStack_60e = (short)((ulong)uVar3 >> 0x10);
  sStack_60c = (short)((ulong)uVar3 >> 0x20);
  sStack_60a = (short)((ulong)uVar3 >> 0x30);
  uVar1 = *(undefined8 *)*in_RDX;
  uVar3 = *(undefined8 *)(*in_RDX + 8);
  local_598 = (short)uVar1;
  sStack_596 = (short)((ulong)uVar1 >> 0x10);
  sStack_594 = (short)((ulong)uVar1 >> 0x20);
  sStack_592 = (short)((ulong)uVar1 >> 0x30);
  sStack_590 = (short)uVar3;
  sStack_58e = (short)((ulong)uVar3 >> 0x10);
  sStack_58c = (short)((ulong)uVar3 >> 0x20);
  sStack_58a = (short)((ulong)uVar3 >> 0x30);
  *(ushort *)*in_RDX = local_598 - (ushort)(local_618 == 0);
  *(ushort *)(*in_RDX + 2) = sStack_596 - (ushort)(sStack_616 == 1);
  *(ushort *)(*in_RDX + 4) = sStack_594 - (ushort)(sStack_614 == 1);
  *(ushort *)(*in_RDX + 6) = sStack_592 - (ushort)(sStack_612 == 1);
  *(ushort *)(*in_RDX + 8) = sStack_590 - (ushort)(sStack_610 == 1);
  *(ushort *)(*in_RDX + 10) = sStack_58e - (ushort)(sStack_60e == 1);
  *(ushort *)(*in_RDX + 0xc) = sStack_58c - (ushort)(sStack_60c == 1);
  *(ushort *)(*in_RDX + 0xe) = sStack_58a - (ushort)(sStack_60a == 1);
  uVar1 = *(undefined8 *)*in_RDX;
  uVar3 = *(undefined8 *)(*in_RDX + 8);
  local_5b8 = (short)uVar1;
  uStack_5b6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_5b4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_5b2 = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_5b0 = (undefined2)uVar3;
  uStack_5ae = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_5ac = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_5aa = (undefined2)((ulong)uVar3 >> 0x30);
  *(short *)*in_RDX = local_5b8 + 1;
  *(undefined2 *)(*in_RDX + 2) = uStack_5b6;
  *(undefined2 *)(*in_RDX + 4) = uStack_5b4;
  *(undefined2 *)(*in_RDX + 6) = uStack_5b2;
  *(undefined2 *)(*in_RDX + 8) = uStack_5b0;
  *(undefined2 *)(*in_RDX + 10) = uStack_5ae;
  *(undefined2 *)(*in_RDX + 0xc) = uStack_5ac;
  *(undefined2 *)(*in_RDX + 0xe) = uStack_5aa;
  uVar1 = *(undefined8 *)*in_RDX;
  uVar3 = *(undefined8 *)*in_RCX;
  local_578 = (short)uVar1;
  sStack_576 = (short)((ulong)uVar1 >> 0x10);
  sStack_574 = (short)((ulong)uVar1 >> 0x20);
  sStack_572 = (short)((ulong)uVar1 >> 0x30);
  local_588 = (short)uVar3;
  sStack_586 = (short)((ulong)uVar3 >> 0x10);
  sStack_584 = (short)((ulong)uVar3 >> 0x20);
  sStack_582 = (short)((ulong)uVar3 >> 0x30);
  uVar1 = *(undefined8 *)(*in_RDX + 8);
  uVar3 = *(undefined8 *)(*in_RCX + 8);
  sStack_550 = (short)uVar1;
  sStack_54e = (short)((ulong)uVar1 >> 0x10);
  sStack_54c = (short)((ulong)uVar1 >> 0x20);
  sStack_54a = (short)((ulong)uVar1 >> 0x30);
  sStack_560 = (short)uVar3;
  sStack_55e = (short)((ulong)uVar3 >> 0x10);
  sStack_55c = (short)((ulong)uVar3 >> 0x20);
  sStack_55a = (short)((ulong)uVar3 >> 0x30);
  auVar15._2_2_ = local_588 + sStack_560;
  auVar15._0_2_ = local_578 + sStack_550;
  auVar15._4_2_ = sStack_576 + sStack_54e;
  auVar15._6_2_ = sStack_586 + sStack_55e;
  auVar15._10_2_ = sStack_582 + sStack_55a;
  auVar15._8_2_ = sStack_572 + sStack_54a;
  auVar15._12_2_ = sStack_574 + sStack_54c;
  auVar15._14_2_ = sStack_584 + sStack_55c;
  auVar14._8_8_ = 0xd2bf2d41d2bf2d41;
  auVar14._0_8_ = 0x2d412d412d412d41;
  auVar24 = pmaddwd(auVar15,auVar14);
  auVar13._2_2_ = local_588 + sStack_560;
  auVar13._0_2_ = local_578 + sStack_550;
  auVar13._4_2_ = sStack_576 + sStack_54e;
  auVar13._6_2_ = sStack_586 + sStack_55e;
  auVar13._10_2_ = sStack_582 + sStack_55a;
  auVar13._8_2_ = sStack_572 + sStack_54a;
  auVar13._12_2_ = sStack_574 + sStack_54c;
  auVar13._14_2_ = sStack_584 + sStack_55c;
  auVar12._8_8_ = 0x2d412d412d412d41;
  auVar12._0_8_ = 0xd2bf2d41d2bf2d41;
  auVar25 = pmaddwd(auVar13,auVar12);
  auVar11._2_2_ = local_588 - sStack_560;
  auVar11._0_2_ = local_578 - sStack_550;
  auVar11._4_2_ = sStack_576 - sStack_54e;
  auVar11._6_2_ = sStack_586 - sStack_55e;
  auVar11._10_2_ = sStack_582 - sStack_55a;
  auVar11._8_2_ = sStack_572 - sStack_54a;
  auVar11._12_2_ = sStack_574 - sStack_54c;
  auVar11._14_2_ = sStack_584 - sStack_55c;
  auVar10._8_8_ = 0xc4df187ec4df187e;
  auVar10._0_8_ = 0x187e3b21187e3b21;
  auVar26 = pmaddwd(auVar11,auVar10);
  auVar9._2_2_ = local_588 - sStack_560;
  auVar9._0_2_ = local_578 - sStack_550;
  auVar9._4_2_ = sStack_576 - sStack_54e;
  auVar9._6_2_ = sStack_586 - sStack_55e;
  auVar9._10_2_ = sStack_582 - sStack_55a;
  auVar9._8_2_ = sStack_572 - sStack_54a;
  auVar9._12_2_ = sStack_574 - sStack_54c;
  auVar9._14_2_ = sStack_584 - sStack_55c;
  auVar8._8_8_ = 0x187e3b21187e3b21;
  auVar8._0_8_ = 0xc4df187ec4df187e;
  auVar27 = pmaddwd(auVar9,auVar8);
  local_318 = auVar24._0_4_;
  iStack_314 = auVar24._4_4_;
  iStack_310 = auVar24._8_4_;
  iStack_30c = auVar24._12_4_;
  local_338 = auVar26._0_4_;
  iStack_334 = auVar26._4_4_;
  iStack_330 = auVar26._8_4_;
  iStack_32c = auVar26._12_4_;
  local_358 = auVar25._0_4_;
  iStack_354 = auVar25._4_4_;
  iStack_350 = auVar25._8_4_;
  iStack_34c = auVar25._12_4_;
  local_378 = auVar27._0_4_;
  iStack_374 = auVar27._4_4_;
  iStack_370 = auVar27._8_4_;
  iStack_36c = auVar27._12_4_;
  auVar24 = ZEXT416(0xe);
  auVar25 = ZEXT416(0xe);
  auVar26 = ZEXT416(0xe);
  auVar27 = ZEXT416(0xe);
  auVar23._4_4_ = iStack_314 + 0x2000 >> auVar24;
  auVar23._0_4_ = local_318 + 0x2000 >> auVar24;
  auVar23._12_4_ = iStack_30c + 0x2000 >> auVar24;
  auVar23._8_4_ = iStack_310 + 0x2000 >> auVar24;
  auVar22._4_4_ = iStack_334 + 0x2000 >> auVar25;
  auVar22._0_4_ = local_338 + 0x2000 >> auVar25;
  auVar22._12_4_ = iStack_32c + 0x2000 >> auVar25;
  auVar22._8_4_ = iStack_330 + 0x2000 >> auVar25;
  auVar24 = packssdw(auVar23,auVar22);
  auVar21._4_4_ = iStack_354 + 0x2000 >> auVar26;
  auVar21._0_4_ = local_358 + 0x2000 >> auVar26;
  auVar21._12_4_ = iStack_34c + 0x2000 >> auVar26;
  auVar21._8_4_ = iStack_350 + 0x2000 >> auVar26;
  auVar20._4_4_ = iStack_374 + 0x2000 >> auVar27;
  auVar20._0_4_ = local_378 + 0x2000 >> auVar27;
  auVar20._12_4_ = iStack_36c + 0x2000 >> auVar27;
  auVar20._8_4_ = iStack_370 + 0x2000 >> auVar27;
  auVar25 = packssdw(auVar21,auVar20);
  local_a08 = auVar24._0_4_;
  uStack_a04 = auVar24._4_4_;
  uStack_a00 = auVar24._8_4_;
  uStack_9fc = auVar24._12_4_;
  *(undefined4 *)*in_RDX = local_a08;
  *(undefined4 *)(*in_RDX + 4) = uStack_a00;
  *(undefined4 *)(*in_RDX + 8) = uStack_a04;
  *(undefined4 *)(*in_RDX + 0xc) = uStack_9fc;
  local_a18 = auVar25._0_4_;
  uStack_a14 = auVar25._4_4_;
  uStack_a10 = auVar25._8_4_;
  uStack_a0c = auVar25._12_4_;
  *(undefined4 *)*in_RCX = uStack_a14;
  *(undefined4 *)(*in_RCX + 4) = uStack_a0c;
  *(undefined4 *)(*in_RCX + 8) = local_a18;
  *(undefined4 *)(*in_RCX + 0xc) = uStack_a10;
  uVar1 = *(undefined8 *)*in_RDX;
  uVar3 = *(undefined8 *)(*in_RDX + 8);
  uVar4 = *(undefined8 *)*in_RCX;
  uVar5 = *(undefined8 *)(*in_RCX + 8);
  local_5f8 = (short)uVar1;
  sStack_5f6 = (short)((ulong)uVar1 >> 0x10);
  sStack_5f4 = (short)((ulong)uVar1 >> 0x20);
  sStack_5f2 = (short)((ulong)uVar1 >> 0x30);
  sStack_5f0 = (short)uVar3;
  sStack_5ee = (short)((ulong)uVar3 >> 0x10);
  sStack_5ec = (short)((ulong)uVar3 >> 0x20);
  sStack_5ea = (short)((ulong)uVar3 >> 0x30);
  local_608 = (short)uVar4;
  sStack_606 = (short)((ulong)uVar4 >> 0x10);
  sStack_604 = (short)((ulong)uVar4 >> 0x20);
  sStack_602 = (short)((ulong)uVar4 >> 0x30);
  sStack_600 = (short)uVar5;
  sStack_5fe = (short)((ulong)uVar5 >> 0x10);
  sStack_5fc = (short)((ulong)uVar5 >> 0x20);
  sStack_5fa = (short)((ulong)uVar5 >> 0x30);
  uVar1 = *(undefined8 *)*in_RDX;
  uVar3 = *(undefined8 *)(*in_RDX + 8);
  uVar4 = *(undefined8 *)*in_RCX;
  uVar5 = *(undefined8 *)(*in_RCX + 8);
  local_538 = (short)uVar1;
  sStack_536 = (short)((ulong)uVar1 >> 0x10);
  sStack_534 = (short)((ulong)uVar1 >> 0x20);
  sStack_532 = (short)((ulong)uVar1 >> 0x30);
  sStack_530 = (short)uVar3;
  sStack_52e = (short)((ulong)uVar3 >> 0x10);
  sStack_52c = (short)((ulong)uVar3 >> 0x20);
  sStack_52a = (short)((ulong)uVar3 >> 0x30);
  local_548 = (short)uVar4;
  sStack_546 = (short)((ulong)uVar4 >> 0x10);
  sStack_544 = (short)((ulong)uVar4 >> 0x20);
  sStack_542 = (short)((ulong)uVar4 >> 0x30);
  sStack_540 = (short)uVar5;
  sStack_53e = (short)((ulong)uVar5 >> 0x10);
  sStack_53c = (short)((ulong)uVar5 >> 0x20);
  sStack_53a = (short)((ulong)uVar5 >> 0x30);
  auVar7._2_2_ = sStack_5f6 + sStack_606;
  auVar7._0_2_ = local_5f8 + local_608;
  auVar7._4_2_ = sStack_5f4 + sStack_604;
  auVar7._6_2_ = sStack_5f2 + sStack_602;
  auVar7._10_2_ = sStack_5ee + sStack_5fe;
  auVar7._8_2_ = sStack_5f0 + sStack_600;
  auVar7._12_2_ = sStack_5ec + sStack_5fc;
  auVar7._14_2_ = sStack_5ea + sStack_5fa;
  auVar28._8_8_ = 0x2d412d412d412d41;
  auVar28._0_8_ = 0x2d412d412d412d41;
  auVar28 = pmaddwd(auVar7,auVar28);
  auVar6._2_2_ = sStack_5f6 + sStack_606;
  auVar6._0_2_ = local_5f8 + local_608;
  auVar6._4_2_ = sStack_5f4 + sStack_604;
  auVar6._6_2_ = sStack_5f2 + sStack_602;
  auVar6._10_2_ = sStack_5ee + sStack_5fe;
  auVar6._8_2_ = sStack_5f0 + sStack_600;
  auVar6._12_2_ = sStack_5ec + sStack_5fc;
  auVar6._14_2_ = sStack_5ea + sStack_5fa;
  auVar29._8_8_ = 0xd2bf2d41d2bf2d41;
  auVar29._0_8_ = 0xd2bf2d41d2bf2d41;
  auVar29 = pmaddwd(auVar6,auVar29);
  auVar27._2_2_ = sStack_536 - sStack_546;
  auVar27._0_2_ = local_538 - local_548;
  auVar27._4_2_ = sStack_534 - sStack_544;
  auVar27._6_2_ = sStack_532 - sStack_542;
  auVar27._10_2_ = sStack_52e - sStack_53e;
  auVar27._8_2_ = sStack_530 - sStack_540;
  auVar27._12_2_ = sStack_52c - sStack_53c;
  auVar27._14_2_ = sStack_52a - sStack_53a;
  auVar26._8_8_ = 0xe782c4dfe782c4df;
  auVar26._0_8_ = 0x187e3b21187e3b21;
  auVar26 = pmaddwd(auVar27,auVar26);
  auVar25._2_2_ = sStack_536 - sStack_546;
  auVar25._0_2_ = local_538 - local_548;
  auVar25._4_2_ = sStack_534 - sStack_544;
  auVar25._6_2_ = sStack_532 - sStack_542;
  auVar25._10_2_ = sStack_52e - sStack_53e;
  auVar25._8_2_ = sStack_530 - sStack_540;
  auVar25._12_2_ = sStack_52c - sStack_53c;
  auVar25._14_2_ = sStack_52a - sStack_53a;
  auVar24._8_8_ = 0x3b21e7823b21e782;
  auVar24._0_8_ = 0xc4df187ec4df187e;
  auVar24 = pmaddwd(auVar25,auVar24);
  local_398 = auVar28._0_4_;
  iStack_394 = auVar28._4_4_;
  iStack_390 = auVar28._8_4_;
  iStack_38c = auVar28._12_4_;
  local_3b8 = auVar29._0_4_;
  iStack_3b4 = auVar29._4_4_;
  iStack_3b0 = auVar29._8_4_;
  iStack_3ac = auVar29._12_4_;
  local_3d8 = auVar26._0_4_;
  iStack_3d4 = auVar26._4_4_;
  iStack_3d0 = auVar26._8_4_;
  iStack_3cc = auVar26._12_4_;
  local_3f8 = auVar24._0_4_;
  iStack_3f4 = auVar24._4_4_;
  iStack_3f0 = auVar24._8_4_;
  iStack_3ec = auVar24._12_4_;
  auVar24 = ZEXT416(0x10);
  auVar25 = ZEXT416(0x10);
  auVar26 = ZEXT416(0x10);
  auVar27 = ZEXT416(0x10);
  auVar19._4_4_ = iStack_394 + 0x6000 >> auVar24;
  auVar19._0_4_ = local_398 + 0x6000 >> auVar24;
  auVar19._12_4_ = iStack_38c + 0x6000 >> auVar24;
  auVar19._8_4_ = iStack_390 + 0x6000 >> auVar24;
  auVar18._4_4_ = iStack_3d4 + 0x6000 >> auVar26;
  auVar18._0_4_ = local_3d8 + 0x6000 >> auVar26;
  auVar18._12_4_ = iStack_3cc + 0x6000 >> auVar26;
  auVar18._8_4_ = iStack_3d0 + 0x6000 >> auVar26;
  auVar24 = packssdw(auVar19,auVar18);
  *in_RDX = auVar24;
  auVar17._4_4_ = iStack_3b4 + 0x6000 >> auVar25;
  auVar17._0_4_ = local_3b8 + 0x6000 >> auVar25;
  auVar17._12_4_ = iStack_3ac + 0x6000 >> auVar25;
  auVar17._8_4_ = iStack_3b0 + 0x6000 >> auVar25;
  auVar16._4_4_ = iStack_3f4 + 0x6000 >> auVar27;
  auVar16._0_4_ = local_3f8 + 0x6000 >> auVar27;
  auVar16._12_4_ = iStack_3ec + 0x6000 >> auVar27;
  auVar16._8_4_ = iStack_3f0 + 0x6000 >> auVar27;
  auVar24 = packssdw(auVar17,auVar16);
  *in_RCX = auVar24;
  return;
}

Assistant:

static void FDCT4x4_2D_HELPER(const int16_t *input, int stride, __m128i *in0,
                              __m128i *in1) {
  // Constants
  // These are the coefficients used for the multiplies.
  // In the comments, pN means cos(N pi /64) and mN is -cos(N pi /64),
  // where cospi_N_64 = cos(N pi /64)
  const __m128i k__cospi_A =
      octa_set_epi16(cospi_16_64, cospi_16_64, cospi_16_64, cospi_16_64,
                     cospi_16_64, -cospi_16_64, cospi_16_64, -cospi_16_64);
  const __m128i k__cospi_B =
      octa_set_epi16(cospi_16_64, -cospi_16_64, cospi_16_64, -cospi_16_64,
                     cospi_16_64, cospi_16_64, cospi_16_64, cospi_16_64);
  const __m128i k__cospi_C =
      octa_set_epi16(cospi_8_64, cospi_24_64, cospi_8_64, cospi_24_64,
                     cospi_24_64, -cospi_8_64, cospi_24_64, -cospi_8_64);
  const __m128i k__cospi_D =
      octa_set_epi16(cospi_24_64, -cospi_8_64, cospi_24_64, -cospi_8_64,
                     cospi_8_64, cospi_24_64, cospi_8_64, cospi_24_64);
  const __m128i k__cospi_E =
      octa_set_epi16(cospi_16_64, cospi_16_64, cospi_16_64, cospi_16_64,
                     cospi_16_64, cospi_16_64, cospi_16_64, cospi_16_64);
  const __m128i k__cospi_F =
      octa_set_epi16(cospi_16_64, -cospi_16_64, cospi_16_64, -cospi_16_64,
                     cospi_16_64, -cospi_16_64, cospi_16_64, -cospi_16_64);
  const __m128i k__cospi_G =
      octa_set_epi16(cospi_8_64, cospi_24_64, cospi_8_64, cospi_24_64,
                     -cospi_8_64, -cospi_24_64, -cospi_8_64, -cospi_24_64);
  const __m128i k__cospi_H =
      octa_set_epi16(cospi_24_64, -cospi_8_64, cospi_24_64, -cospi_8_64,
                     -cospi_24_64, cospi_8_64, -cospi_24_64, cospi_8_64);

  const __m128i k__DCT_CONST_ROUNDING = _mm_set1_epi32(DCT_CONST_ROUNDING);
  // This second rounding constant saves doing some extra adds at the end
  const __m128i k__DCT_CONST_ROUNDING2 =
      _mm_set1_epi32(DCT_CONST_ROUNDING + (DCT_CONST_ROUNDING << 1));
  const int DCT_CONST_BITS2 = DCT_CONST_BITS + 2;
  const __m128i k__nonzero_bias_a = _mm_setr_epi16(0, 1, 1, 1, 1, 1, 1, 1);
  const __m128i k__nonzero_bias_b = _mm_setr_epi16(1, 0, 0, 0, 0, 0, 0, 0);

  // Load inputs.
  *in0 = _mm_loadl_epi64((const __m128i *)(input + 0 * stride));
  *in1 = _mm_loadl_epi64((const __m128i *)(input + 1 * stride));
  *in1 = _mm_unpacklo_epi64(
      *in1, _mm_loadl_epi64((const __m128i *)(input + 2 * stride)));
  *in0 = _mm_unpacklo_epi64(
      *in0, _mm_loadl_epi64((const __m128i *)(input + 3 * stride)));
  // in0 = [i0 i1 i2 i3 iC iD iE iF]
  // in1 = [i4 i5 i6 i7 i8 i9 iA iB]
  // multiply by 16 to give some extra precision
  *in0 = _mm_slli_epi16(*in0, 4);
  *in1 = _mm_slli_epi16(*in1, 4);
  // if (i == 0 && input[0]) input[0] += 1;
  // add 1 to the upper left pixel if it is non-zero, which helps reduce
  // the round-trip error
  {
    // The mask will only contain whether the first value is zero, all
    // other comparison will fail as something shifted by 4 (above << 4)
    // can never be equal to one. To increment in the non-zero case, we
    // add the mask and one for the first element:
    //   - if zero, mask = -1, v = v - 1 + 1 = v
    //   - if non-zero, mask = 0, v = v + 0 + 1 = v + 1
    __m128i mask = _mm_cmpeq_epi16(*in0, k__nonzero_bias_a);
    *in0 = _mm_add_epi16(*in0, mask);
    *in0 = _mm_add_epi16(*in0, k__nonzero_bias_b);
  }
  // There are 4 total stages, alternating between an add/subtract stage
  // followed by an multiply-and-add stage.
  {
    // Stage 1: Add/subtract

    // in0 = [i0 i1 i2 i3 iC iD iE iF]
    // in1 = [i4 i5 i6 i7 i8 i9 iA iB]
    const __m128i r0 = _mm_unpacklo_epi16(*in0, *in1);
    const __m128i r1 = _mm_unpackhi_epi16(*in0, *in1);
    // r0 = [i0 i4 i1 i5 i2 i6 i3 i7]
    // r1 = [iC i8 iD i9 iE iA iF iB]
    const __m128i r2 = _mm_shuffle_epi32(r0, 0xB4);
    const __m128i r3 = _mm_shuffle_epi32(r1, 0xB4);
    // r2 = [i0 i4 i1 i5 i3 i7 i2 i6]
    // r3 = [iC i8 iD i9 iF iB iE iA]

    const __m128i t0 = _mm_add_epi16(r2, r3);
    const __m128i t1 = _mm_sub_epi16(r2, r3);
    // t0 = [a0 a4 a1 a5 a3 a7 a2 a6]
    // t1 = [aC a8 aD a9 aF aB aE aA]

    // Stage 2: multiply by constants (which gets us into 32 bits).
    // The constants needed here are:
    // k__cospi_A = [p16 p16 p16 p16 p16 m16 p16 m16]
    // k__cospi_B = [p16 m16 p16 m16 p16 p16 p16 p16]
    // k__cospi_C = [p08 p24 p08 p24 p24 m08 p24 m08]
    // k__cospi_D = [p24 m08 p24 m08 p08 p24 p08 p24]
    const __m128i u0 = _mm_madd_epi16(t0, k__cospi_A);
    const __m128i u2 = _mm_madd_epi16(t0, k__cospi_B);
    const __m128i u1 = _mm_madd_epi16(t1, k__cospi_C);
    const __m128i u3 = _mm_madd_epi16(t1, k__cospi_D);
    // Then add and right-shift to get back to 16-bit range
    const __m128i v0 = _mm_add_epi32(u0, k__DCT_CONST_ROUNDING);
    const __m128i v1 = _mm_add_epi32(u1, k__DCT_CONST_ROUNDING);
    const __m128i v2 = _mm_add_epi32(u2, k__DCT_CONST_ROUNDING);
    const __m128i v3 = _mm_add_epi32(u3, k__DCT_CONST_ROUNDING);
    const __m128i w0 = _mm_srai_epi32(v0, DCT_CONST_BITS);
    const __m128i w1 = _mm_srai_epi32(v1, DCT_CONST_BITS);
    const __m128i w2 = _mm_srai_epi32(v2, DCT_CONST_BITS);
    const __m128i w3 = _mm_srai_epi32(v3, DCT_CONST_BITS);
    // w0 = [b0 b1 b7 b6]
    // w1 = [b8 b9 bF bE]
    // w2 = [b4 b5 b3 b2]
    // w3 = [bC bD bB bA]
    const __m128i x0 = _mm_packs_epi32(w0, w1);
    const __m128i x1 = _mm_packs_epi32(w2, w3);

    // x0 = [b0 b1 b7 b6 b8 b9 bF bE]
    // x1 = [b4 b5 b3 b2 bC bD bB bA]
    *in0 = _mm_shuffle_epi32(x0, 0xD8);
    *in1 = _mm_shuffle_epi32(x1, 0x8D);
    // in0 = [b0 b1 b8 b9 b7 b6 bF bE]
    // in1 = [b3 b2 bB bA b4 b5 bC bD]
  }
  {
    // vertical DCTs finished. Now we do the horizontal DCTs.
    // Stage 3: Add/subtract

    const __m128i t0 = ADD_EPI16(*in0, *in1);
    const __m128i t1 = SUB_EPI16(*in0, *in1);

    // Stage 4: multiply by constants (which gets us into 32 bits).
    {
      // The constants needed here are:
      // k__cospi_E = [p16 p16 p16 p16 p16 p16 p16 p16]
      // k__cospi_F = [p16 m16 p16 m16 p16 m16 p16 m16]
      // k__cospi_G = [p08 p24 p08 p24 m08 m24 m08 m24]
      // k__cospi_H = [p24 m08 p24 m08 m24 p08 m24 p08]
      const __m128i u0 = _mm_madd_epi16(t0, k__cospi_E);
      const __m128i u1 = _mm_madd_epi16(t0, k__cospi_F);
      const __m128i u2 = _mm_madd_epi16(t1, k__cospi_G);
      const __m128i u3 = _mm_madd_epi16(t1, k__cospi_H);
      // Then add and right-shift to get back to 16-bit range
      // but this combines the final right-shift as well to save operations
      // This unusual rounding operations is to maintain bit-accurate
      // compatibility with the c version of this function which has two
      // rounding steps in a row.
      const __m128i v0 = _mm_add_epi32(u0, k__DCT_CONST_ROUNDING2);
      const __m128i v1 = _mm_add_epi32(u1, k__DCT_CONST_ROUNDING2);
      const __m128i v2 = _mm_add_epi32(u2, k__DCT_CONST_ROUNDING2);
      const __m128i v3 = _mm_add_epi32(u3, k__DCT_CONST_ROUNDING2);
      const __m128i w0 = _mm_srai_epi32(v0, DCT_CONST_BITS2);
      const __m128i w1 = _mm_srai_epi32(v1, DCT_CONST_BITS2);
      const __m128i w2 = _mm_srai_epi32(v2, DCT_CONST_BITS2);
      const __m128i w3 = _mm_srai_epi32(v3, DCT_CONST_BITS2);
      *in0 = _mm_packs_epi32(w0, w2);
      *in1 = _mm_packs_epi32(w1, w3);
    }
  }
}